

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Production.cpp
# Opt level: O3

size_t __thiscall
SGParser::Generator::ParseTableProduction::PrintRHS
          (ParseTableProduction *this,String *str,
          map<unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
          *pgrammarSymbolsInv,bool printDot)

{
  uint uVar1;
  pointer pcVar2;
  _Alloc_hider _Var3;
  Production *pPVar4;
  mapped_type *ppbVar5;
  undefined7 in_register_00000009;
  ulong uVar6;
  key_type *__k;
  long lVar7;
  pointer local_80;
  size_type *local_78;
  String dest;
  String local_50;
  
  dest.field_2._12_4_ = (undefined4)CONCAT71(in_register_00000009,printDot);
  local_78 = &dest._M_string_length;
  dest._M_dataplus._M_p = (pointer)0x0;
  dest._M_string_length._0_1_ = 0;
  pPVar4 = this->pProduction;
  if (pPVar4->Length == 0) {
    uVar6 = 0;
    local_80 = (pointer)0x0;
  }
  else {
    lVar7 = 4;
    uVar6 = 0;
    local_80 = (pointer)0x0;
    do {
      if (uVar6 == this->Dot) {
        local_80 = dest._M_dataplus._M_p;
        if (dest.field_2._M_local_buf[0xc] != '\0') {
          std::__cxx11::string::append((char *)&local_78);
          pPVar4 = this->pProduction;
        }
      }
      uVar1 = *(uint *)((long)pPVar4->pRight + lVar7);
      __k = (key_type *)((long)pPVar4->pRight + lVar7);
      if ((int)uVar1 < 0) {
        if (pgrammarSymbolsInv ==
            (map<unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
             *)0x0) {
          if ((uVar1 & 0xfffffff) < 0x22) {
            StringWithFormat<char>(&local_50,"\'%X\' ",(ulong)(uVar1 & 0xfffffff));
            std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_50._M_dataplus._M_p);
          }
          else {
            StringWithFormat<char>(&local_50,"\'%c\' ",(ulong)(uint)(int)(char)((char)uVar1 + -2));
            std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_50._M_dataplus._M_p);
          }
        }
        else {
          ppbVar5 = std::
                    map<unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
                    ::operator[](pgrammarSymbolsInv,__k);
          StringWithFormat<char>(&local_50,"\'%s\' ",((*ppbVar5)->_M_dataplus)._M_p);
          std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_50._M_dataplus._M_p);
        }
      }
      else if (pgrammarSymbolsInv ==
               (map<unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
                *)0x0) {
        StringWithFormat<char>(&local_50,"%u ");
        std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_50._M_dataplus._M_p);
      }
      else {
        ppbVar5 = std::
                  map<unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>
                  ::operator[](pgrammarSymbolsInv,__k);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        pcVar2 = ((*ppbVar5)->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,pcVar2,pcVar2 + (*ppbVar5)->_M_string_length);
        std::__cxx11::string::append((char *)&local_50);
        std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_50._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      uVar6 = uVar6 + 1;
      pPVar4 = this->pProduction;
      lVar7 = lVar7 + 4;
    } while (uVar6 < pPVar4->Length);
  }
  _Var3._M_p = dest._M_dataplus._M_p;
  if ((this->Dot == (uint)uVar6) && (local_80 = _Var3._M_p, dest.field_2._M_local_buf[0xc] != '\0'))
  {
    std::__cxx11::string::append((char *)&local_78);
  }
  std::__cxx11::string::swap((string *)str);
  if (local_78 != &dest._M_string_length) {
    operator_delete(local_78,CONCAT71(dest._M_string_length._1_7_,(undefined1)dest._M_string_length)
                             + 1);
  }
  return (size_t)local_80;
}

Assistant:

size_t ParseTableProduction::PrintRHS(String& str,
                                      std::map<unsigned, const String*>* pgrammarSymbolsInv,
                                      bool printDot) const {
    String dest;
    size_t dotPos = 0u;

    // Go through all right hand side terminals and store them
    unsigned i = 0u;
    for (; i < pProduction->Length; ++i) {
        if (Dot == i) {
            dotPos = dest.size();
            if (printDot)
                dest += "* ";
        }

        if (pProduction->Right(i) & ProductionMask::Terminal) {
            if (pgrammarSymbolsInv)
                dest += StringWithFormat("'%s' ",
                                         (*pgrammarSymbolsInv)[pProduction->Right(i)]->data());
            else {
                const unsigned terminal = pProduction->Right(i) & ProductionMask::TerminalValue;
                if (terminal < 32u + TokenCode::TokenFirstID)
                    dest += StringWithFormat("'%X' ", terminal);
                else
                    dest += StringWithFormat("'%c' ", char(terminal - TokenCode::TokenFirstID));
            }
        } else {
            if (pgrammarSymbolsInv)
                dest += *(*pgrammarSymbolsInv)[pProduction->Right(i)] + " ";
            else
                dest += StringWithFormat("%u ", pProduction->Right(i));
        }
    }

    if (Dot == i) {
        dotPos = dest.size();
        if (printDot)
            dest += "* ";
    }

    str.swap(dest);

    return dotPos;
}